

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# askclickpos.cpp
# Opt level: O0

Am_Object am_askclickpos_Initialize(void)

{
  Am_Method_Wrapper *value;
  Am_Object *pAVar1;
  Am_Wrapper *pAVar2;
  Am_Object *pAVar3;
  Am_Constraint *pAVar4;
  Am_Object *pAVar5;
  Am_Value_List *this;
  Am_Object_Data *in_RDI;
  Am_Input_Char local_84;
  Am_Value local_80;
  Am_Object local_70;
  Am_Value_List local_68;
  Am_Object local_58;
  Am_Object local_50;
  Am_Object local_48;
  Am_Object local_40;
  Am_Object local_38;
  Am_Object local_30 [3];
  Am_Object local_18 [2];
  
  Am_Object::Create(local_18,(char *)&Am_Window);
  value = Am_Object_Method::operator_cast_to_Am_Method_Wrapper_
                    (&Am_Default_Pop_Up_Window_Destroy_Method);
  pAVar1 = Am_Object::Set(local_18,0x89,value,0);
  pAVar2 = Am_Style::operator_cast_to_Am_Wrapper_(&Am_Amulet_Purple);
  pAVar1 = Am_Object::Set(pAVar1,0x6a,pAVar2,0);
  pAVar1 = Am_Object::Set(pAVar1,0x6c,"Specify Location",0);
  pAVar1 = Am_Object::Set(pAVar1,0x6d,"Specify Location",0);
  pAVar1 = Am_Object::Set(pAVar1,0x66,0x169,0);
  pAVar1 = Am_Object::Set(pAVar1,0x67,0x66,0);
  pAVar1 = Am_Object::Add(pAVar1,0x169,0,0);
  Am_Object::operator=(&am_askclickpos,pAVar1);
  Am_Object::~Am_Object(local_18);
  Am_Object::Create(&local_38,(char *)&Am_Text);
  pAVar1 = Am_Object::Set(&local_38,100,0x1f,0);
  pAVar1 = Am_Object::Set(pAVar1,0x65,0xe,0);
  pAVar1 = Am_Object::Set(pAVar1,0x66,0x1db,0);
  pAVar1 = Am_Object::Set(pAVar1,0x67,0xf,0);
  pAVar1 = Am_Object::Set(pAVar1,0xab,"Click in the window to define a new position",0);
  pAVar2 = Am_Style::operator_cast_to_Am_Wrapper_(&Am_Black);
  pAVar1 = Am_Object::Set(pAVar1,0x6b,pAVar2,0);
  pAVar2 = Am_Style::operator_cast_to_Am_Wrapper_(&Am_No_Style);
  pAVar1 = Am_Object::Set(pAVar1,0x6a,pAVar2,0);
  Am_Object::Am_Object(local_30,pAVar1);
  pAVar1 = Am_Object::Add_Part(&am_askclickpos,0x150,local_30,0);
  Am_Object::Create(&local_48,(char *)&Am_Text);
  pAVar3 = Am_Object::Set(&local_48,100,0x1f,0);
  pAVar3 = Am_Object::Set(pAVar3,0x65,0x1d,0);
  pAVar3 = Am_Object::Set(pAVar3,0x66,0x5b,0);
  pAVar3 = Am_Object::Set(pAVar3,0x67,0xf,0);
  pAVar3 = Am_Object::Set(pAVar3,0xab,"or hit cancel",0);
  pAVar2 = Am_Style::operator_cast_to_Am_Wrapper_(&Am_Black);
  pAVar3 = Am_Object::Set(pAVar3,0x6b,pAVar2,0);
  pAVar2 = Am_Style::operator_cast_to_Am_Wrapper_(&Am_No_Style);
  pAVar3 = Am_Object::Set(pAVar3,0x6a,pAVar2,0);
  Am_Object::Am_Object(&local_40,pAVar3);
  pAVar1 = Am_Object::Add_Part(pAVar1,&local_40,true,0);
  Am_Object::Create(&local_58,(char *)&Am_Button_Panel);
  pAVar4 = Am_Formula::operator_cast_to_Am_Constraint_(&Am_Center_X_Is_Center_Of_Owner);
  pAVar3 = Am_Object::Set(&local_58,100,pAVar4,0);
  pAVar3 = Am_Object::Set(pAVar3,0x65,0x30,0);
  pAVar2 = Am_Style::operator_cast_to_Am_Wrapper_(&Am_Amulet_Purple);
  pAVar3 = Am_Object::Set(pAVar3,0x6a,pAVar2,0);
  pAVar4 = Am_Formula::operator_cast_to_Am_Constraint_(&Am_Horizontal_Layout);
  pAVar3 = Am_Object::Set(pAVar3,0x94,pAVar4,0);
  pAVar3 = Am_Object::Set(pAVar3,0x95,0,0);
  pAVar3 = Am_Object::Set(pAVar3,0x96,0,0);
  pAVar3 = Am_Object::Set(pAVar3,0x9c,0,0);
  Am_Value_List::Am_Value_List(&local_68);
  Am_Object::Create(&local_70,(char *)&Am_Standard_Cancel_Command);
  pAVar5 = Am_Object::Set(&local_70,0x180,true,0);
  Am_Input_Char::Am_Input_Char(&local_84,"RETURN",true);
  Am_Input_Char::operator_cast_to_Am_Value((Am_Input_Char *)&local_80);
  pAVar5 = Am_Object::Set(pAVar5,0x152,&local_80,0);
  pAVar2 = Am_Object::operator_cast_to_Am_Wrapper_(pAVar5);
  this = Am_Value_List::Add(&local_68,pAVar2,Am_TAIL,true);
  pAVar2 = Am_Value_List::operator_cast_to_Am_Wrapper_(this);
  pAVar3 = Am_Object::Set(pAVar3,0xa2,pAVar2,0);
  Am_Object::Am_Object(&local_50,pAVar3);
  Am_Object::Add_Part(pAVar1,&local_50,true,0);
  Am_Object::~Am_Object(&local_50);
  Am_Value::~Am_Value(&local_80);
  Am_Object::~Am_Object(&local_70);
  Am_Value_List::~Am_Value_List(&local_68);
  Am_Object::~Am_Object(&local_58);
  Am_Object::~Am_Object(&local_40);
  Am_Object::~Am_Object(&local_48);
  Am_Object::~Am_Object(local_30);
  Am_Object::~Am_Object(&local_38);
  Am_Object::Am_Object((Am_Object *)in_RDI,&am_askclickpos);
  return (Am_Object)in_RDI;
}

Assistant:

Am_Object
am_askclickpos_Initialize()
{
  am_askclickpos = Am_Window.Create(DSTR("am_askclickpos"))
                       .Set(Am_DESTROY_WINDOW_METHOD,
                            Am_Default_Pop_Up_Window_Destroy_Method)
                       .Set(Am_FILL_STYLE, Am_Amulet_Purple)
                       .Set(Am_TITLE, "Specify Location")
                       .Set(Am_ICON_TITLE, "Specify Location")
                       .Set(Am_WIDTH, 361)
                       .Set(Am_HEIGHT, 102)
                       .Add(Am_VALUE, (0L));
  am_askclickpos
      .Add_Part(
          Am_LABEL,
          Am_Text.Create()
              .Set(Am_LEFT, 31)
              .Set(Am_TOP, 14)
              .Set(Am_WIDTH, 475)
              .Set(Am_HEIGHT, 15)
              .Set(Am_TEXT, "Click in the window to define a new position")
              .Set(Am_LINE_STYLE, Am_Black)
              .Set(Am_FILL_STYLE, Am_No_Style))
      .Add_Part(Am_Text.Create()
                    .Set(Am_LEFT, 31)
                    .Set(Am_TOP, 29)
                    .Set(Am_WIDTH, 91)
                    .Set(Am_HEIGHT, 15)
                    .Set(Am_TEXT, "or hit cancel")
                    .Set(Am_LINE_STYLE, Am_Black)
                    .Set(Am_FILL_STYLE, Am_No_Style))
      .Add_Part(Am_Button_Panel.Create()
                    .Set(Am_LEFT, Am_Center_X_Is_Center_Of_Owner)
                    .Set(Am_TOP, 48)
                    .Set(Am_FILL_STYLE, Am_Amulet_Purple)
                    .Set(Am_LAYOUT, Am_Horizontal_Layout)
                    .Set(Am_H_SPACING, 0)
                    .Set(Am_V_SPACING, 0)
                    .Set(Am_MAX_RANK, 0)
                    .Set(Am_ITEMS, Am_Value_List().Add(
                                       Am_Standard_Cancel_Command.Create()
                                           .Set(Am_DEFAULT, true)
                                           .Set(Am_ACCELERATOR,
                                                Am_Input_Char("RETURN")))));
  return am_askclickpos;
}